

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

void __thiscall spvtools::opt::LoopPeeling::PeelBefore(LoopPeeling *this,uint32_t peel_factor)

{
  IRContext *context;
  Loop *this_00;
  BasicBlock *bb;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t true_value;
  uint32_t false_value;
  Instruction *this_01;
  Instruction *this_02;
  BasicBlock *pBVar4;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  InstructionBuilder builder;
  LoopCloningResult clone_results;
  
  bVar1 = CanPeelLoop(this);
  if (bVar1) {
    LoopUtils::LoopCloningResult::LoopCloningResult(&clone_results);
    DuplicateAndConnectLoop(this,&clone_results);
    InsertCanonicalInductionVariable(this,&clone_results);
    context = this->context_;
    BasicBlock::tail((BasicBlock *)&local_168);
    InstructionBuilder::InstructionBuilder
              (&builder,context,(Instruction *)local_168._M_unused._0_8_,
               kAnalysisInstrToBlockMapping|kAnalysisBegin);
    this_01 = InstructionBuilder::GetIntConstant<unsigned_int>
                        (&builder,peel_factor,this->int_type_->signed_);
    uVar2 = Instruction::result_id(this_01);
    uVar3 = Instruction::result_id(this->loop_iteration_count_);
    this_02 = InstructionBuilder::AddLessThan(&builder,uVar2,uVar3);
    uVar2 = Instruction::type_id(this_01);
    uVar3 = Instruction::result_id(this_02);
    true_value = Instruction::result_id(this_01);
    false_value = Instruction::result_id(this->loop_iteration_count_);
    local_168._M_unused._M_object =
         InstructionBuilder::AddSelect(&builder,uVar2,uVar3,true_value,false_value);
    local_150 = std::
                _Function_handler<unsigned_int_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:439:20)>
                ::_M_invoke;
    local_158 = std::
                _Function_handler<unsigned_int_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:439:20)>
                ::_M_manager;
    local_168._8_8_ = this;
    FixExitCondition(this,(function<unsigned_int_(spvtools::opt::Instruction_*)> *)&local_168);
    if (local_158 != (code *)0x0) {
      (*local_158)(&local_168,&local_168,3);
    }
    this_00 = this->loop_;
    bb = this_00->loop_merge_;
    pBVar4 = CreateBlockBefore(this,bb);
    Loop::SetMergeBlock(this_00,pBVar4);
    pBVar4 = ProtectLoop(this,this->loop_,this_02,bb);
    local_168._8_8_ = 0;
    local_168._M_unused._M_object = ::operator_new(0x18);
    *(LoopCloningResult **)local_168._M_unused._0_8_ = &clone_results;
    *(BasicBlock **)((long)local_168._M_unused._0_8_ + 8) = pBVar4;
    *(LoopPeeling **)((long)local_168._M_unused._0_8_ + 0x10) = this;
    local_150 = std::
                _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:458:7)>
                ::_M_invoke;
    local_158 = std::
                _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:458:7)>
                ::_M_manager;
    BasicBlock::ForEachPhiInst(bb,(function<void_(spvtools::opt::Instruction_*)> *)&local_168,false)
    ;
    if (local_158 != (code *)0x0) {
      (*local_158)(&local_168,&local_168,3);
    }
    IRContext::InvalidateAnalysesExceptFor
              (this->context_,
               kAnalysisLoopAnalysis|kAnalysisCFG|kAnalysisInstrToBlockMapping|kAnalysisBegin);
    LoopUtils::LoopCloningResult::~LoopCloningResult(&clone_results);
    return;
  }
  __assert_fail("CanPeelLoop() && \"Cannot peel loop\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                ,0x19f,"void spvtools::opt::LoopPeeling::PeelBefore(uint32_t)");
}

Assistant:

void LoopPeeling::PeelBefore(uint32_t peel_factor) {
  assert(CanPeelLoop() && "Cannot peel loop");
  LoopUtils::LoopCloningResult clone_results;

  // Clone the loop and insert the cloned one before the loop.
  DuplicateAndConnectLoop(&clone_results);

  // Add a canonical induction variable "canonical_induction_variable_".
  InsertCanonicalInductionVariable(&clone_results);

  InstructionBuilder builder(
      context_, &*cloned_loop_->GetPreHeaderBlock()->tail(),
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  Instruction* factor =
      builder.GetIntConstant(peel_factor, int_type_->IsSigned());

  Instruction* has_remaining_iteration = builder.AddLessThan(
      factor->result_id(), loop_iteration_count_->result_id());
  Instruction* max_iteration = builder.AddSelect(
      factor->type_id(), has_remaining_iteration->result_id(),
      factor->result_id(), loop_iteration_count_->result_id());

  // Change the exit condition of the cloned loop to be (exit when become
  // false):
  //  "canonical_induction_variable_" < min("factor", "loop_iteration_count_")
  FixExitCondition([max_iteration, this](Instruction* insert_before_point) {
    return InstructionBuilder(context_, insert_before_point,
                              IRContext::kAnalysisDefUse |
                                  IRContext::kAnalysisInstrToBlockMapping)
        .AddLessThan(canonical_induction_variable_->result_id(),
                     max_iteration->result_id())
        ->result_id();
  });

  // "Protect" the second loop: the second loop can only be executed if
  // |has_remaining_iteration| is true (i.e. factor < loop_iteration_count_).
  BasicBlock* if_merge_block = loop_->GetMergeBlock();
  loop_->SetMergeBlock(CreateBlockBefore(loop_->GetMergeBlock()));
  // Prevent the second loop from being executed if we already executed all the
  // required iterations.
  BasicBlock* if_block =
      ProtectLoop(loop_, has_remaining_iteration, if_merge_block);
  // Patch the phi of the merge block.
  if_merge_block->ForEachPhiInst(
      [&clone_results, if_block, this](Instruction* phi) {
        // if_merge_block had previously only 1 predecessor.
        uint32_t incoming_value = phi->GetSingleWordInOperand(0);
        auto def_in_loop = clone_results.value_map_.find(incoming_value);
        if (def_in_loop != clone_results.value_map_.end())
          incoming_value = def_in_loop->second;
        phi->AddOperand(
            {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {incoming_value}});
        phi->AddOperand(
            {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {if_block->id()}});
        context_->get_def_use_mgr()->AnalyzeInstUse(phi);
      });

  context_->InvalidateAnalysesExceptFor(
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping |
      IRContext::kAnalysisLoopAnalysis | IRContext::kAnalysisCFG);
}